

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaWorker.cpp
# Opt level: O2

void __thiscall xmrig::CudaWorker::start(CudaWorker *this)

{
  bool bVar1;
  int iVar2;
  uint roundSize;
  uint32_t foundCount;
  uint32_t foundNonce [10];
  uint local_5c;
  duration<long,_std::ratio<1L,_1000L>_> local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  do {
    if (DAT_001bde60 == 0) {
      return;
    }
    if (((Nonce::m_paused & 1) != 0) || ((ready & 1) == 0)) {
      do {
        local_58.__r = 200;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_58);
        if (((Nonce::m_paused & 1) == 0) && ((ready & 1) != 0)) break;
      } while (DAT_001bde60 != 0);
      if (DAT_001bde60 == 0) {
        return;
      }
      bVar1 = consumeJob(this);
      if (!bVar1) {
        return;
      }
    }
    while (DAT_001bde60 == (this->m_job).m_sequence) {
      local_48 = 0;
      uStack_40 = 0;
      local_58.__r = 0;
      uStack_50 = 0;
      local_38 = 0;
      local_5c = 0;
      iVar2 = (*this->m_runner->_vptr_ICudaRunner[4])
                        (this->m_runner,
                         (ulong)*(uint *)((this->m_job).m_blobs[(this->m_job).m_index] + 0x27),
                         &local_5c,&local_58);
      if ((char)iVar2 == '\0') {
        return;
      }
      if ((ulong)local_5c != 0) {
        JobResults::submit((this->m_job).m_jobs + (this->m_job).m_index,(uint32_t *)&local_58,
                           (ulong)local_5c);
      }
      roundSize = (*(this->super_Worker).super_IWorker._vptr_IWorker[5])(this);
      WorkerJob<1UL>::nextRound(&this->m_job,(int)(0x8000 / (ulong)roundSize) + 1,roundSize);
      storeStats(this);
      sched_yield();
    }
    bVar1 = consumeJob(this);
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void xmrig::CudaWorker::start()
{
    while (Nonce::sequence(Nonce::CUDA) > 0) {
        if (!isReady()) {
            do {
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
            }
            while (!isReady() && Nonce::sequence(Nonce::CUDA) > 0);

            if (Nonce::sequence(Nonce::CUDA) == 0) {
                break;
            }

            if (!consumeJob()) {
                return;
            }
        }

        while (!Nonce::isOutdated(Nonce::CUDA, m_job.sequence())) {
            uint32_t foundNonce[10] = { 0 };
            uint32_t foundCount     = 0;

            if (!m_runner->run(*m_job.nonce(), &foundCount, foundNonce)) {
                return;
            }

            if (foundCount) {
                JobResults::submit(m_job.currentJob(), foundNonce, foundCount);
            }

            const size_t batch_size = intensity();
            m_job.nextRound(roundSize(batch_size), batch_size);

            storeStats();
            std::this_thread::yield();
        }

        if (!consumeJob()) {
            return;
        }
    }
}